

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
diligent_spirv_cross::CompilerGLSL::to_combined_image_sampler_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,VariableID image_id,VariableID samp_id)

{
  Parameter *pPVar1;
  SPIRFunction *pSVar2;
  Parameter *pPVar3;
  size_t sVar4;
  CombinedImageSampler *pCVar5;
  bool bVar6;
  long lVar7;
  SPIRVariable *pSVar8;
  SPIRVariable *pSVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  CompilerError *pCVar13;
  long lVar14;
  Parameter *pPVar15;
  CombinedImageSampler *pCVar16;
  CombinedImageSampler *pCVar17;
  Parameter *pPVar18;
  Parameter *pPVar19;
  uint32_t uVar20;
  CombinedImageSamplerParameter *__it;
  CombinedImageSamplerParameter *pCVar21;
  undefined1 local_98 [32];
  CombinedImageSamplerParameter *local_78;
  string array_expr;
  string image_expr;
  
  uVar11 = (ulong)image_id.id;
  to_non_uniform_aware_expression_abi_cxx11_(&image_expr,this,image_id.id);
  array_expr._M_dataplus._M_p = (pointer)&array_expr.field_2;
  array_expr._M_string_length = 0;
  array_expr.field_2._M_local_buf[0] = '\0';
  lVar7 = ::std::__cxx11::string::find((char)&image_expr,0x5b);
  if (lVar7 != -1) {
    ::std::__cxx11::string::substr((ulong)local_98,(ulong)&image_expr);
    ::std::__cxx11::string::operator=((string *)&array_expr,(string *)local_98);
    ::std::__cxx11::string::~string((string *)local_98);
  }
  pSVar2 = (this->super_Compiler).current_function;
  pSVar8 = Compiler::maybe_get_backing_variable(&this->super_Compiler,image_id.id);
  pSVar9 = Compiler::maybe_get_backing_variable(&this->super_Compiler,samp_id.id);
  if (pSVar8 != (SPIRVariable *)0x0) {
    uVar11 = (ulong)(pSVar8->super_IVariant).self.id;
  }
  if (pSVar9 != (SPIRVariable *)0x0) {
    samp_id.id = (pSVar9->super_IVariant).self.id;
  }
  pPVar3 = (pSVar2->arguments).super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.ptr;
  sVar4 = (pSVar2->arguments).super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.
          buffer_size;
  lVar10 = sVar4 * 0x14;
  pPVar1 = pPVar3 + sVar4;
  lVar14 = (long)sVar4 >> 2;
  pPVar19 = pPVar3;
  for (lVar7 = lVar14; uVar20 = (uint32_t)uVar11, pPVar18 = pPVar19, 0 < lVar7; lVar7 = lVar7 + -1)
  {
    if ((pPVar19->id).id == uVar20) goto LAB_00637846;
    if (pPVar19[1].id.id == uVar20) {
      pPVar18 = pPVar19 + 1;
      goto LAB_00637846;
    }
    if (pPVar19[2].id.id == uVar20) {
      pPVar18 = pPVar19 + 2;
      goto LAB_00637846;
    }
    if (pPVar19[3].id.id == uVar20) {
      pPVar18 = pPVar19 + 3;
      goto LAB_00637846;
    }
    pPVar19 = pPVar19 + 4;
    lVar10 = lVar10 + -0x50;
  }
  lVar10 = lVar10 / 0x14;
  if (lVar10 == 1) {
LAB_00637825:
    pPVar18 = pPVar19;
    if ((pPVar19->id).id != uVar20) {
      pPVar18 = pPVar1;
    }
  }
  else if (lVar10 == 2) {
LAB_0063781b:
    if ((pPVar18->id).id != uVar20) {
      pPVar19 = pPVar18 + 1;
      goto LAB_00637825;
    }
  }
  else {
    pPVar18 = pPVar1;
    if ((lVar10 == 3) && (pPVar18 = pPVar19, (pPVar19->id).id != uVar20)) {
      pPVar18 = pPVar19 + 1;
      goto LAB_0063781b;
    }
  }
LAB_00637846:
  lVar7 = sVar4 * 0x14;
  pPVar19 = pPVar3;
  for (; pPVar15 = pPVar19, 0 < lVar14; lVar14 = lVar14 + -1) {
    if ((pPVar19->id).id == samp_id.id) goto LAB_006378c6;
    if (pPVar19[1].id.id == samp_id.id) {
      pPVar15 = pPVar19 + 1;
      goto LAB_006378c6;
    }
    if (pPVar19[2].id.id == samp_id.id) {
      pPVar15 = pPVar19 + 2;
      goto LAB_006378c6;
    }
    if (pPVar19[3].id.id == samp_id.id) {
      pPVar15 = pPVar19 + 3;
      goto LAB_006378c6;
    }
    pPVar19 = pPVar19 + 4;
    lVar7 = lVar7 + -0x50;
  }
  lVar7 = lVar7 / 0x14;
  if (lVar7 == 1) {
LAB_006378a5:
    pPVar15 = pPVar19;
    if ((pPVar19->id).id != samp_id.id) {
      pPVar15 = pPVar1;
    }
  }
  else if (lVar7 == 2) {
LAB_0063789b:
    if ((pPVar15->id).id != samp_id.id) {
      pPVar19 = pPVar15 + 1;
      goto LAB_006378a5;
    }
  }
  else {
    pPVar15 = pPVar1;
    if ((lVar7 == 3) && (pPVar15 = pPVar19, (pPVar19->id).id != samp_id.id)) {
      pPVar15 = pPVar19 + 1;
      goto LAB_0063789b;
    }
  }
LAB_006378c6:
  if (pPVar18 == pPVar1) {
    if (pPVar15 == pPVar1) {
      pCVar5 = (this->super_Compiler).combined_image_samplers.
               super_VectorView<diligent_spirv_cross::CombinedImageSampler>.ptr;
      sVar4 = (this->super_Compiler).combined_image_samplers.
              super_VectorView<diligent_spirv_cross::CombinedImageSampler>.buffer_size;
      lVar7 = sVar4 * 0xc;
      pCVar17 = pCVar5 + 2;
      for (lVar10 = (long)sVar4 >> 2; 0 < lVar10; lVar10 = lVar10 + -1) {
        if ((pCVar17[-2].image_id.id == uVar20) && (pCVar17[-2].sampler_id.id == samp_id.id)) {
          pCVar16 = pCVar17 + -2;
          goto LAB_00637b7b;
        }
        if ((pCVar17[-1].image_id.id == uVar20) && (pCVar17[-1].sampler_id.id == samp_id.id)) {
          pCVar16 = pCVar17 + -1;
          goto LAB_00637b7b;
        }
        if (((pCVar17->image_id).id == uVar20) &&
           (pCVar16 = pCVar17, (pCVar17->sampler_id).id == samp_id.id)) goto LAB_00637b7b;
        if ((pCVar17[1].image_id.id == uVar20) && (pCVar17[1].sampler_id.id == samp_id.id)) {
          pCVar16 = pCVar17 + 1;
          goto LAB_00637b7b;
        }
        pCVar17 = pCVar17 + 4;
        lVar7 = lVar7 + -0x30;
      }
      lVar7 = lVar7 / 0xc;
      pCVar16 = pCVar17 + -2;
      if (lVar7 == 1) {
LAB_00637bcc:
        if (((pCVar16->image_id).id != uVar20) || ((pCVar16->sampler_id).id != samp_id.id))
        goto LAB_00637bd8;
      }
      else if (lVar7 == 3) {
        if ((pCVar17[-2].image_id.id != uVar20) || (pCVar17[-2].sampler_id.id != samp_id.id)) {
          pCVar16 = pCVar17 + -1;
          goto LAB_00637bbc;
        }
      }
      else {
        if (lVar7 != 2) goto LAB_00637bd8;
LAB_00637bbc:
        if (((pCVar16->image_id).id != uVar20) || ((pCVar16->sampler_id).id != samp_id.id)) {
          pCVar16 = pCVar16 + 1;
          goto LAB_00637bcc;
        }
      }
LAB_00637b7b:
      if (pCVar16 == pCVar5 + sVar4) {
LAB_00637bd8:
        pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (pCVar13,
                   "Cannot find mapping for combined sampler, was build_combined_image_samplers() used before compile() was called?"
                  );
        __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      to_expression_abi_cxx11_((string *)local_98,this,(pCVar16->combined_id).id,true);
      ::std::operator+(__return_storage_ptr__,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,&array_expr);
      goto LAB_00637a2e;
    }
LAB_006378f3:
    samp_id.id = (uint32_t)(((long)pPVar15 - (long)pPVar3) / 0x14);
    uVar12 = 0;
  }
  else {
    uVar11 = ((long)pPVar18 - (long)pPVar3) / 0x14;
    if (pPVar15 != pPVar1) goto LAB_006378f3;
    uVar12 = 0x100;
  }
  pSVar2 = (this->super_Compiler).current_function;
  __it = (pSVar2->combined_parameters).
         super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
  sVar4 = (pSVar2->combined_parameters).
          super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.
          buffer_size;
  lVar10 = sVar4 * 0x10;
  local_78 = __it + sVar4;
  local_98._0_8_ = (ulong)(pPVar18 == pPVar1) | uVar11 << 0x20 | uVar12;
  local_98._8_4_ = samp_id.id;
  for (lVar7 = (long)sVar4 >> 2; pCVar21 = __it, 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<diligent_spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:7589:54)>
                          *)local_98,__it);
    if (bVar6) goto LAB_006379fe;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<diligent_spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:7589:54)>
                          *)local_98,__it + 1);
    pCVar21 = __it + 1;
    if (bVar6) goto LAB_006379fe;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<diligent_spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:7589:54)>
                          *)local_98,__it + 2);
    pCVar21 = __it + 2;
    if (bVar6) goto LAB_006379fe;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<diligent_spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:7589:54)>
                          *)local_98,__it + 3);
    pCVar21 = __it + 3;
    if (bVar6) goto LAB_006379fe;
    __it = __it + 4;
    lVar10 = lVar10 + -0x40;
  }
  lVar10 = lVar10 >> 4;
  if (lVar10 == 1) {
LAB_00637afb:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<diligent_spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:7589:54)>
                          *)local_98,__it);
    pCVar21 = __it;
    if (!bVar6) goto LAB_00637b13;
  }
  else if (lVar10 == 2) {
LAB_00637ad7:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<diligent_spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:7589:54)>
                          *)local_98,__it);
    pCVar21 = __it;
    if (!bVar6) {
      __it = __it + 1;
      goto LAB_00637afb;
    }
  }
  else {
    if (lVar10 != 3) goto LAB_00637b13;
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<diligent_spirv_cross::CompilerGLSL::to_combined_image_sampler[abi:cxx11](diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>,diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)2>)::$_2>
            ::operator()((_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Cross_spirv_glsl_cpp:7589:54)>
                          *)local_98,__it);
    if (!bVar6) {
      __it = __it + 1;
      goto LAB_00637ad7;
    }
  }
LAB_006379fe:
  if (pCVar21 != local_78) {
    to_expression_abi_cxx11_((string *)local_98,this,(pCVar21->id).id,true);
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     &array_expr);
LAB_00637a2e:
    ::std::__cxx11::string::~string((string *)local_98);
    ::std::__cxx11::string::~string((string *)&array_expr);
    ::std::__cxx11::string::~string((string *)&image_expr);
    return __return_storage_ptr__;
  }
LAB_00637b13:
  pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (pCVar13,
             "Cannot find mapping for combined sampler parameter, was build_combined_image_samplers() used before compile() was called?"
            );
  __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string CompilerGLSL::to_combined_image_sampler(VariableID image_id, VariableID samp_id)
{
	// Keep track of the array indices we have used to load the image.
	// We'll need to use the same array index into the combined image sampler array.
	auto image_expr = to_non_uniform_aware_expression(image_id);
	string array_expr;
	auto array_index = image_expr.find_first_of('[');
	if (array_index != string::npos)
		array_expr = image_expr.substr(array_index, string::npos);

	auto &args = current_function->arguments;

	// For GLSL and ESSL targets, we must enumerate all possible combinations for sampler2D(texture2D, sampler) and redirect
	// all possible combinations into new sampler2D uniforms.
	auto *image = maybe_get_backing_variable(image_id);
	auto *samp = maybe_get_backing_variable(samp_id);
	if (image)
		image_id = image->self;
	if (samp)
		samp_id = samp->self;

	auto image_itr = find_if(begin(args), end(args),
	                         [image_id](const SPIRFunction::Parameter &param) { return image_id == param.id; });

	auto sampler_itr = find_if(begin(args), end(args),
	                           [samp_id](const SPIRFunction::Parameter &param) { return samp_id == param.id; });

	if (image_itr != end(args) || sampler_itr != end(args))
	{
		// If any parameter originates from a parameter, we will find it in our argument list.
		bool global_image = image_itr == end(args);
		bool global_sampler = sampler_itr == end(args);
		VariableID iid = global_image ? image_id : VariableID(uint32_t(image_itr - begin(args)));
		VariableID sid = global_sampler ? samp_id : VariableID(uint32_t(sampler_itr - begin(args)));

		auto &combined = current_function->combined_parameters;
		auto itr = find_if(begin(combined), end(combined), [=](const SPIRFunction::CombinedImageSamplerParameter &p) {
			return p.global_image == global_image && p.global_sampler == global_sampler && p.image_id == iid &&
			       p.sampler_id == sid;
		});

		if (itr != end(combined))
			return to_expression(itr->id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler parameter, was "
			                  "build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
	else
	{
		// For global sampler2D, look directly at the global remapping table.
		auto &mapping = combined_image_samplers;
		auto itr = find_if(begin(mapping), end(mapping), [image_id, samp_id](const CombinedImageSampler &combined) {
			return combined.image_id == image_id && combined.sampler_id == samp_id;
		});

		if (itr != end(combined_image_samplers))
			return to_expression(itr->combined_id) + array_expr;
		else
		{
			SPIRV_CROSS_THROW("Cannot find mapping for combined sampler, was build_combined_image_samplers() used "
			                  "before compile() was called?");
		}
	}
}